

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

char * strtok(char *__s,char *__delim)

{
  char cVar1;
  char cVar2;
  size_t res;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  
  if (__s == (char *)0x0) {
    __s = strtok::last;
  }
  do {
    pcVar5 = __s;
    cVar2 = *pcVar5;
    if (cVar2 == '\0') {
      return (char *)0x0;
    }
    pcVar3 = __delim;
    while (cVar1 = *pcVar3, __s = pcVar5 + 1, cVar2 != cVar1) {
      pcVar3 = pcVar3 + 1;
      if (cVar1 == '\0') {
        lVar4 = 0;
        pcVar3 = __delim;
        pcVar6 = pcVar5;
        goto LAB_001017c7;
      }
    }
  } while( true );
  while( true ) {
    lVar4 = lVar4 + 1;
    cVar2 = pcVar6[1];
    pcVar6 = pcVar6 + 1;
    pcVar3 = __delim;
    if (cVar2 == '\0') break;
LAB_001017c7:
    do {
      cVar1 = *pcVar3;
      if (cVar2 == cVar1) goto LAB_001017e4;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != '\0');
  }
LAB_001017e4:
  pcVar3 = pcVar5 + lVar4;
  strtok::last = pcVar3;
  if (pcVar5[lVar4] != '\0') {
    strtok::last = pcVar3 + 1;
    *pcVar3 = '\0';
  }
  return pcVar5;
}

Assistant:

char *strtok(char *s, const char *delim) {
    static char *last;

    if (s == NULL) {
        s = last;
    }
    int ch;
    do {
        ch = *s++;
        if (ch == '\0') {
            return NULL;
        }
    } while (strchr(delim, ch));
    --s;
    last = s + strcspn(s, delim);
    if (*last != '\0') {
        *last++ = '\0';
    }
    return s;
}